

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O3

Map_Cut_t * Map_CutSortCuts(Map_Man_t *pMan,Map_CutTable_t *p,Map_Cut_t *pList)

{
  uint uVar1;
  Map_Cut_t **ppMVar2;
  uint uVar3;
  Map_Cut_t *pMVar4;
  long lVar5;
  ulong uVar6;
  Map_Cut_t *pMVar7;
  int iVar8;
  ulong uVar9;
  Map_Cut_t *local_28;
  
  pMVar4 = (Map_Cut_t *)&stack0xffffffffffffffd8;
  ppMVar2 = p->pCuts1;
  if (pList == (Map_Cut_t *)0x0) {
    qsort(ppMVar2,0,8,Map_CutSortCutsCompare);
    local_28 = (Map_Cut_t *)0x0;
    pMVar4 = (Map_Cut_t *)&stack0xffffffffffffffd8;
  }
  else {
    lVar5 = 0;
    uVar9 = 0;
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      lVar5 = lVar5 + 0x100000000;
      ppMVar2[uVar9] = pList;
      pList = pList->pNext;
      uVar9 = uVar9 + 1;
      uVar1 = uVar3 + 1;
    } while (pList != (Map_Cut_t *)0x0);
    iVar8 = (int)uVar9;
    if (1000 < iVar8) {
      __assert_fail("nCuts <= MAP_CUTS_MAX_COMPUTE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                    ,0x3ef,"Map_Cut_t *Map_CutSortCuts(Map_Man_t *, Map_CutTable_t *, Map_Cut_t *)")
      ;
    }
    qsort(p->pCuts1,lVar5 >> 0x20,8,Map_CutSortCutsCompare);
    if (iVar8 < 0xfa) {
      ppMVar2 = p->pCuts1;
      local_28 = (Map_Cut_t *)0x0;
      if (iVar8 < 1) goto LAB_003fe31b;
    }
    else {
      uVar9 = 0xf9;
      do {
        Extra_MmFixedEntryRecycle(pMan->mmCuts,(char *)p->pCuts1[uVar9]);
        uVar9 = uVar9 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar9);
      ppMVar2 = p->pCuts1;
      uVar9 = 0xf9;
    }
    local_28 = (Map_Cut_t *)0x0;
    uVar6 = 0;
    pMVar7 = (Map_Cut_t *)&stack0xffffffffffffffd8;
    do {
      pMVar4 = ppMVar2[uVar6];
      pMVar7->pNext = pMVar4;
      uVar6 = uVar6 + 1;
      pMVar7 = pMVar4;
    } while ((uVar9 & 0xffffffff) != uVar6);
  }
LAB_003fe31b:
  pMVar4->pNext = (Map_Cut_t *)0x0;
  return local_28;
}

Assistant:

Map_Cut_t * Map_CutSortCuts( Map_Man_t * pMan, Map_CutTable_t * p, Map_Cut_t * pList )
{
    Map_Cut_t * pListNew;
    int nCuts, i;
//    abctime clk;
    // move the cuts from the list into the array
    nCuts = Map_CutList2Array( p->pCuts1, pList );
    assert( nCuts <= MAP_CUTS_MAX_COMPUTE );
    // sort the cuts
//clk = Abc_Clock();
    qsort( (void *)p->pCuts1, (size_t)nCuts, sizeof(Map_Cut_t *), 
            (int (*)(const void *, const void *)) Map_CutSortCutsCompare );
//pMan->time2 += Abc_Clock() - clk;
    // move them back into the list
    if ( nCuts > MAP_CUTS_MAX_USE - 1 )
    {
        // free the remaining cuts
        for ( i = MAP_CUTS_MAX_USE - 1; i < nCuts; i++ )
            Extra_MmFixedEntryRecycle( pMan->mmCuts, (char *)p->pCuts1[i] );
        // update the number of cuts
        nCuts = MAP_CUTS_MAX_USE - 1;
    }
    pListNew = Map_CutArray2List( p->pCuts1, nCuts );
    return pListNew;
}